

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_extension.cc
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_5bbd1::PyIterCtrlPMatchSource<cpsm::FullLineMatch>::fill
          (PyListCtrlPMatchSource<cpsm::FullLineMatch> *this,
          vector<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,_cpsm::FullLineMatch>,_true>,_std::allocator<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,_cpsm::FullLineMatch>,_true>_>_>
          *items)

{
  bool bVar1;
  Py_ssize_t PVar2;
  PyObjPtr *in_RSI;
  long in_RDI;
  Py_ssize_t i;
  anon_class_8_1_a817d6e0 add_item;
  lock_guard<std::mutex> lock;
  pointer in_stack_ffffffffffffff78;
  undefined7 in_stack_ffffffffffffff80;
  byte in_stack_ffffffffffffff87;
  undefined8 local_38;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  undefined1 local_1;
  
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80)
             ,(mutex_type *)in_stack_ffffffffffffff78);
  if ((*(byte *)(in_RDI + 0x30) & 1) == 0) {
    local_38 = 0;
    while( true ) {
      PVar2 = batch_size();
      if (PVar2 <= local_38) break;
      PyIter_Next(*(undefined8 *)(in_RDI + 0x28));
      std::unique_ptr<_object,(anonymous_namespace)::PyObjectDeleter>::
      unique_ptr<(anonymous_namespace)::PyObjectDeleter,void>
                ((unique_ptr<_object,_(anonymous_namespace)::PyObjectDeleter> *)
                 CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
                 in_stack_ffffffffffffff78);
      bVar1 = fill::anon_class_8_1_a817d6e0::operator()
                        ((anon_class_8_1_a817d6e0 *)
                         CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),in_RSI);
      in_stack_ffffffffffffff87 = bVar1 ^ 0xff;
      std::unique_ptr<_object,_(anonymous_namespace)::PyObjectDeleter>::~unique_ptr
                ((unique_ptr<_object,_(anonymous_namespace)::PyObjectDeleter> *)
                 (CONCAT17(bVar1,in_stack_ffffffffffffff80) ^ 0xff00000000000000));
      if ((in_stack_ffffffffffffff87 & 1) != 0) {
        *(undefined1 *)(in_RDI + 0x30) = 1;
        local_1 = false;
        goto LAB_0014d48e;
      }
      local_38 = local_38 + 1;
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
LAB_0014d48e:
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x14d498);
  return local_1;
}

Assistant:

bool fill(std::vector<Item>& items) {
    std::lock_guard<std::mutex> lock(mu_);
    if (done_) {
      return false;
    }
    auto const add_item = [&](PyObjPtr item_obj) {
      if (item_obj == nullptr) {
        return false;
      }
      char* item_data;
      Py_ssize_t item_size;
      if (!PyVimString_AsStringAndSize(item_obj.get(), &item_data,
                                       &item_size)) {
        return false;
      }
      items.emplace_back(
          cpsm::CtrlPItem<cpsm::StringRefItem, MatchMode>(
              (cpsm::StringRefItem(boost::string_ref(item_data, item_size)))),
          std::move(item_obj));
      return true;
    };
    for (Py_ssize_t i = 0; i < batch_size(); i++) {
      if (!add_item(PyObjPtr(PyIter_Next(iter_)))) {
        done_ = true;
        return false;
      }
    }
    return true;
  }